

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdCombinedd(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint uVar1;
  x86Argument arg;
  x86Argument arg_00;
  CodeGenRegVmContext *pCVar2;
  x86Argument local_98;
  x86Argument local_78;
  x86Argument local_58;
  x86Argument local_38;
  CodeGenRegVmContext *local_18;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._2_1_ = cmd.rB;
  uVar1 = (uint)ctx_local._2_1_;
  local_18 = ctx;
  ctx_local = (CodeGenRegVmContext *)cmd;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,uVar1 << 3);
  EMIT_OP_REG_RPTR(&local_18->ctx,o_mov,rEDX,sDWORD,rEBX,(uint)ctx_local._3_1_ << 3);
  EMIT_OP_RPTR_REG(&local_18->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEAX);
  EMIT_OP_RPTR_REG(&local_18->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ * 8 + 4,rEDX);
  pCVar2 = local_18;
  x86Argument::x86Argument(&local_38,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3);
  CodeGenGenericContext::MemInvalidate(&pCVar2->ctx,&local_38);
  pCVar2 = local_18;
  x86Argument::x86Argument(&local_58,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3);
  arg.field_1.imm64Arg = local_58.field_1.imm64Arg;
  arg.type = local_58.type;
  arg._4_4_ = local_58._4_4_;
  arg.ptrBase = local_58.ptrBase;
  arg.ptrIndex = local_58.ptrIndex;
  arg.ptrMult = local_58.ptrMult;
  arg.ptrNum = local_58.ptrNum;
  CodeGenGenericContext::InvalidateAddressValue(&pCVar2->ctx,arg);
  pCVar2 = local_18;
  x86Argument::x86Argument(&local_78,sDWORD,rEBX,(uint)ctx_local._1_1_ * 8 + 4);
  CodeGenGenericContext::MemInvalidate(&pCVar2->ctx,&local_78);
  pCVar2 = local_18;
  x86Argument::x86Argument(&local_98,sDWORD,rEBX,(uint)ctx_local._1_1_ * 8 + 4);
  arg_00.field_1.imm64Arg = local_98.field_1.imm64Arg;
  arg_00.type = local_98.type;
  arg_00._4_4_ = local_98._4_4_;
  arg_00.ptrBase = local_98.ptrBase;
  arg_00.ptrIndex = local_98.ptrIndex;
  arg_00.ptrMult = local_98.ptrMult;
  arg_00.ptrNum = local_98.ptrNum;
  CodeGenGenericContext::InvalidateAddressValue(&pCVar2->ctx,arg_00);
  return;
}

Assistant:

void GenCodeCmdCombinedd(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8); // Load low value
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rC * 8); // Load high value

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store to target
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);

#if defined(_M_X64)
	// To avoid partial 'register' reads later
	ctx.ctx.MemInvalidate(x86Argument(sDWORD, rREG, cmd.rA * 8));
	ctx.ctx.InvalidateAddressValue(x86Argument(sDWORD, rREG, cmd.rA * 8));
	ctx.ctx.MemInvalidate(x86Argument(sDWORD, rREG, cmd.rA * 8 + 4));
	ctx.ctx.InvalidateAddressValue(x86Argument(sDWORD, rREG, cmd.rA * 8 + 4));
#endif
}